

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_longlong_range_validation(void)

{
  cargo_t ctx;
  int iVar1;
  cargo_validation_t *vd;
  char *pcVar2;
  cargo_t cargo;
  char *args [3];
  longlong a;
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    iVar1 = cargo_add_option(cargo,0,"--alpha -a",(char *)0x0,"L");
    ctx = cargo;
    if (iVar1 == 0) {
      vd = cargo_validate_longlong_range(10,0x14);
      iVar1 = cargo_add_validation(ctx,CARGO_VALIDATION_NONE,"--alpha",vd);
      if (iVar1 == 0) {
        args[2] = "-2";
        args[0] = "program";
        args[1] = "--alpha";
        iVar1 = cargo_parse(cargo,0,1,3,args);
        if (iVar1 < 0) {
          args[2] = "10";
          args[0] = "program";
          args[1] = "--alpha";
          iVar1 = cargo_parse(cargo,0,1,3,args);
          pcVar2 = "Failed to parse";
          if (iVar1 == 0) {
            args[2] = "15";
            args[0] = "program";
            args[1] = "--alpha";
            iVar1 = cargo_parse(cargo,0,1,3,args);
            if (iVar1 == 0) {
              args[2] = "20";
              args[0] = "program";
              args[1] = "--alpha";
              iVar1 = cargo_parse(cargo,0,1,3,args);
              if (iVar1 == 0) {
                args[2] = "123";
                args[0] = "program";
                args[1] = "--alpha";
                pcVar2 = (char *)0x0;
                iVar1 = cargo_parse(cargo,0,1,3,args);
                if (-1 < iVar1) {
                  pcVar2 = "Expected parse failure for 123";
                }
              }
            }
          }
        }
        else {
          pcVar2 = "Expected parse failure for -2";
        }
      }
      else {
        pcVar2 = "Failed to add validation";
      }
    }
    else {
      pcVar2 = "Failed to add option";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_longlong_range_validation)
{
    long long int a = 0;
    _CARGO_ADD_TEST_VALIDATE("L", &a, cargo_validate_longlong_range, 10, 20);
    _CARGO_TEST_VALIDATE_VALUE(-2, 1);
    _CARGO_TEST_VALIDATE_VALUE(10, 0);
    _CARGO_TEST_VALIDATE_VALUE(15, 0);
    _CARGO_TEST_VALIDATE_VALUE(20, 0);
    _CARGO_TEST_VALIDATE_VALUE(123, 1);
    _TEST_CLEANUP();
}